

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

FileInfo * __thiscall anon_unknown.dwarf_b0fca::BuildValue::getOutputInfo(BuildValue *this)

{
  if ((this->kind & ~SuccessfulCommand) != ExistingInput) {
    __assert_fail("(isExistingInput() || isSuccessfulCommand()) && \"invalid call for value kind\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                  ,0x11a,"const FileInfo &(anonymous namespace)::BuildValue::getOutputInfo() const")
    ;
  }
  if (this->numOutputInfos < 2) {
    return (FileInfo *)&this->valueData;
  }
  __assert_fail("!hasMultipleOutputs() && \"invalid call on result with multiple outputs\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                ,0x11c,"const FileInfo &(anonymous namespace)::BuildValue::getOutputInfo() const");
}

Assistant:

const FileInfo& getOutputInfo() const {
    assert((isExistingInput() || isSuccessfulCommand()) &&
           "invalid call for value kind");
    assert(!hasMultipleOutputs() &&
           "invalid call on result with multiple outputs");
    return valueData.asOutputInfo;
  }